

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O3

int read_single_lle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              Dwarf_Half address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,
              Dwarf_Unsigned *opsblocksize,Dwarf_Unsigned *opsoffset,Dwarf_Small **ops,
              Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  long lVar2;
  byte bVar3;
  Dwarf_Unsigned DVar4;
  int iVar5;
  char *pcVar6;
  Dwarf_Signed errval;
  ulong uVar7;
  ulong uVar8;
  Dwarf_Small *pDVar9;
  ulong uVar10;
  Dwarf_Small *pDVar11;
  Dwarf_Unsigned loc_ops_overall_size;
  Dwarf_Unsigned lu_local;
  ulong local_80;
  ulong local_78;
  Dwarf_Unsigned lopsoffset;
  Dwarf_Small *lopsdata;
  Dwarf_Unsigned loc_ops_len;
  Dwarf_Unsigned lu_leblen;
  ulong local_38;
  
  loc_ops_overall_size = 0;
  loc_ops_len = 0;
  lopsdata = (Dwarf_Small *)0x0;
  lopsoffset = 0;
  if (enddata <= data) {
    pcVar6 = 
    "DW_DLE_LOCLISTS_ERROR: An lle entry begins past the end of its allowed space. Corrupt DWARF.";
    goto LAB_001b3582;
  }
  bVar3 = *data;
  uVar7 = (ulong)bVar3;
  if (8 < bVar3) {
    if (error == (Dwarf_Error *)0x0) {
      return 1;
    }
    dwarfstring_constructor((dwarfstring_s *)&lu_leblen);
    dwarfstring_append_printf_u
              ((dwarfstring_s *)&lu_leblen,
               "DW_DLE_LOCLISTS_ERROR: The loclists entry at .debug_loclists offset 0x%x",dataoffset
              );
    dwarfstring_append_printf_u((dwarfstring_s *)&lu_leblen," has code 0x%x which is unknown",uVar7)
    ;
    pcVar6 = dwarfstring_string((dwarfstring_s *)&lu_leblen);
    _dwarf_error_string(dbg,error,0x1d5,pcVar6);
    dwarfstring_destructor((dwarfstring_s *)&lu_leblen);
    return 1;
  }
  pDVar9 = data + 1;
  switch(uVar7) {
  case 0:
    uVar8 = 1;
    uVar10 = uVar7;
    break;
  case 1:
    lu_leblen = 0;
    lu_local = 0;
    iVar5 = dwarf_decode_leb128((char *)pDVar9,&lu_leblen,&lu_local,(char *)enddata);
    uVar10 = lu_local;
    DVar4 = lu_leblen;
    if (iVar5 != 1) goto LAB_001b38c4;
    goto LAB_001b3797;
  default:
    lu_leblen = 0;
    lu_local = 0;
    iVar5 = dwarf_decode_leb128((char *)pDVar9,&lu_leblen,&lu_local,(char *)enddata);
    DVar4 = lu_leblen;
    if (iVar5 != 1) {
      local_78 = lu_local;
      pDVar9 = pDVar9 + lu_leblen;
      lu_leblen = 0;
      lu_local = 0;
      iVar5 = dwarf_decode_leb128((char *)pDVar9,&lu_leblen,&lu_local,(char *)enddata);
      if (iVar5 != 1) {
        local_80 = lu_local;
        local_38 = lu_leblen;
        pDVar9 = pDVar9 + lu_leblen;
        iVar5 = counted_loc_descr(dbg,pDVar9,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                                  &loc_ops_len,&lopsdata,&lopsoffset,error);
        if (iVar5 != 0) {
          return 1;
        }
        lVar2 = loc_ops_overall_size + DVar4 + local_38;
        pDVar9 = pDVar9 + loc_ops_overall_size;
        goto LAB_001b3952;
      }
    }
LAB_001b3797:
    pcVar6 = "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d";
    errval = 0x149;
    goto LAB_001b358d;
  case 5:
    iVar5 = counted_loc_descr(dbg,pDVar9,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                              &loc_ops_len,&lopsdata,&lopsoffset,error);
    if (iVar5 != 0) {
      return 1;
    }
    uVar10 = 0;
    DVar4 = loc_ops_overall_size;
LAB_001b38c4:
    uVar7 = 0;
    pDVar9 = pDVar9 + DVar4;
    uVar8 = DVar4 + 1;
    break;
  case 6:
    lu_leblen = 0;
    uVar10 = (ulong)address_size;
    if (enddata < pDVar9 + uVar10) goto LAB_001b370c;
    (*dbg->de_copy_word)(&lu_leblen,pDVar9,uVar10);
    uVar8 = uVar10 + 1;
    uVar7 = 0;
    pDVar9 = pDVar9 + uVar10;
    uVar10 = lu_leblen;
    break;
  case 7:
    lu_leblen = 0;
    uVar7 = (ulong)address_size;
    pDVar1 = pDVar9 + uVar7;
    if (pDVar1 <= enddata) {
      (*dbg->de_copy_word)(&lu_leblen,pDVar9,uVar7);
      DVar4 = lu_leblen;
      lu_leblen = 0;
      pDVar11 = pDVar1 + uVar7;
      if (pDVar11 <= enddata) {
        local_78 = DVar4;
        (*dbg->de_copy_word)(&lu_leblen,pDVar1,uVar7);
        local_80 = lu_leblen;
        iVar5 = counted_loc_descr(dbg,pDVar11,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                                  &loc_ops_len,&lopsdata,&lopsoffset,error);
        if (iVar5 != 0) {
          return 1;
        }
        lVar2 = loc_ops_overall_size + uVar7 * 2;
        goto LAB_001b394f;
      }
    }
LAB_001b370c:
    lu_leblen = 0;
    pcVar6 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
    errval = 0x14b;
    goto LAB_001b358d;
  case 8:
    lu_leblen = 0;
    uVar7 = (ulong)address_size;
    pDVar11 = pDVar9 + uVar7;
    if (enddata < pDVar11) {
      pcVar6 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
      errval = 0x14b;
      goto LAB_001b358d;
    }
    local_38 = uVar7;
    (*dbg->de_copy_word)(&lu_leblen,pDVar9,uVar7);
    local_78 = lu_leblen;
    lu_leblen = 0;
    lu_local = 0;
    iVar5 = dwarf_decode_leb128((char *)pDVar11,&lu_leblen,&lu_local,(char *)enddata);
    DVar4 = lu_leblen;
    if (iVar5 == 1) {
      pcVar6 = "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d";
      errval = 0x149;
      goto LAB_001b358d;
    }
    local_80 = lu_local;
    pDVar11 = pDVar11 + lu_leblen;
    iVar5 = counted_loc_descr(dbg,pDVar11,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                              &loc_ops_len,&lopsdata,&lopsoffset,error);
    if (iVar5 != 0) {
      return 1;
    }
    lVar2 = loc_ops_overall_size + local_38 + (DVar4 & 0xffffffff);
LAB_001b394f:
    pDVar9 = pDVar11 + loc_ops_overall_size;
LAB_001b3952:
    uVar8 = lVar2 + 1;
    uVar7 = local_80;
    uVar10 = local_78;
  }
  if (enddata < pDVar9 || pDVar9 < data) {
    pcVar6 = "DW_DLE_LOCLISTS_ERROR: The end of an lle entry is past the end of its allowed space";
  }
  else {
    if (uVar8 <= (dbg->de_debug_loclists).dss_size) {
      *bytes_count_out = (uint)uVar8;
      *entry_kind = (uint)bVar3;
      *entry_operand1 = uVar10;
      *entry_operand2 = uVar7;
      *opsblocksize = loc_ops_len;
      *opsoffset = lopsoffset;
      *ops = lopsdata;
      return 0;
    }
    pcVar6 = 
    "DW_DLE_LOCLISTS_ERROR: The number of bytes in a single loclist entry is too large to be reasonable"
    ;
  }
LAB_001b3582:
  errval = 0x1d5;
LAB_001b358d:
  _dwarf_error_string(dbg,error,errval,pcVar6);
  return 1;
}

Assistant:

static int
read_single_lle_entry(Dwarf_Debug dbg,
    Dwarf_Small    *data,
    Dwarf_Unsigned  dataoffset,
    Dwarf_Small    *enddata,
    Dwarf_Half      address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Unsigned *opsblocksize, /* Just the  expr data */
    Dwarf_Unsigned *opsoffset, /* Just the expr ops data */
    Dwarf_Small   **ops, /*  pointer to expr ops ops */
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned int   code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Unsigned loc_ops_overall_size = 0;
    Dwarf_Unsigned loc_ops_count_len = 0;
    Dwarf_Unsigned loc_ops_len = 0;
    Dwarf_Small   *lopsdata = 0;
    Dwarf_Unsigned lopsoffset = 0;
    Dwarf_Small   *startdata = 0;

    /*  Some of these have a  Counted Location Description
        in them. */
    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
            "DW_DLE_LOCLISTS_ERROR: "
            "An lle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_LLE_end_of_list: break;
    case DW_LLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_LLE_startx_endx:
    case DW_LLE_startx_length:
    case DW_LLE_offset_pair: {
        int res = 0;

        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data  += loc_ops_overall_size;

        }
        break;
    case DW_LLE_default_location: {
        int res = 0;

        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        data +=  loc_ops_overall_size;
        count +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_LLE_start_end: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_start_length: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += (unsigned)leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    default: {
        if (error) {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_LOCLISTS_ERROR: "
                "The loclists entry at .debug_loclists"
                " offset 0x%x" ,dataoffset);
            dwarfstring_append_printf_u(&m,
                " has code 0x%x which is unknown",code);
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
        }
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/
        Dwarf_Unsigned sectionsize = dbg->de_debug_loclists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The end of an lle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The number of bytes in a single "
                "loclist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }
    *bytes_count_out = (unsigned)count;
    *entry_kind      = (unsigned)code;
    *entry_operand1  = val1;
    *entry_operand2  = val2;
    *opsblocksize    = loc_ops_len;
    *opsoffset = lopsoffset;
    *ops       = lopsdata;
    return DW_DLV_OK;
}